

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O0

void __thiscall
capnp::DynamicList::Builder::adopt(Builder *this,uint index,Orphan<capnp::DynamicValue> *orphan)

{
  StructBuilder other;
  uint index_00;
  Which WVar1;
  StructSize size;
  Type TVar2;
  uint uVar3;
  InterfaceSchema other_00;
  OrphanBuilder *pOVar4;
  bool local_1e9;
  bool local_1d1;
  bool local_1c1;
  PointerBuilder local_190;
  Fault local_178;
  Fault f_5;
  InterfaceSchema elementType_2;
  Fault f_4;
  StructBuilder local_148;
  StructBuilder local_120;
  Fault local_f8;
  Fault f_3;
  StructSchema elementType_1;
  Fault local_d0;
  Fault f_2;
  ListSchema elementType;
  Fault local_a0;
  Fault f_1;
  Fault local_80;
  Fault f;
  Reader local_68;
  Orphan<capnp::DynamicValue> *local_20;
  Orphan<capnp::DynamicValue> *orphan_local;
  Builder *pBStack_10;
  uint index_local;
  Builder *this_local;
  
  local_20 = orphan;
  orphan_local._4_4_ = index;
  pBStack_10 = this;
  WVar1 = ListSchema::whichElementType(&this->schema);
  index_00 = orphan_local._4_4_;
  switch(WVar1) {
  case VOID:
  case BOOL:
  case INT8:
  case INT16:
  case INT32:
  case INT64:
  case UINT8:
  case UINT16:
  case UINT32:
  case UINT64:
  case FLOAT32:
  case FLOAT64:
  case ENUM:
    Orphan<capnp::DynamicValue>::getReader(&local_68,local_20);
    set(this,index_00,&local_68);
    DynamicValue::Reader::~Reader(&local_68);
    break;
  case TEXT:
    TVar2 = Orphan<capnp::DynamicValue>::getType(local_20);
    if (TVar2 != TEXT) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[21]>
                (&local_80,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
                 ,0x529,FAILED,"orphan.getType() == DynamicValue::TEXT","\"Value type mismatch.\"",
                 (char (*) [21])"Value type mismatch.");
      kj::_::Debug::Fault::fatal(&local_80);
    }
    uVar3 = bounded<unsigned_int>(orphan_local._4_4_);
    _::ListBuilder::getPointerElement((PointerBuilder *)&f_1,&this->builder,uVar3);
    pOVar4 = kj::mv<capnp::_::OrphanBuilder>(&local_20->builder);
    _::PointerBuilder::adopt((PointerBuilder *)&f_1,pOVar4);
    break;
  case DATA:
    TVar2 = Orphan<capnp::DynamicValue>::getType(local_20);
    if (TVar2 != DATA) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[21]>
                (&local_a0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
                 ,0x52e,FAILED,"orphan.getType() == DynamicValue::DATA","\"Value type mismatch.\"",
                 (char (*) [21])"Value type mismatch.");
      kj::_::Debug::Fault::fatal(&local_a0);
    }
    uVar3 = bounded<unsigned_int>(orphan_local._4_4_);
    _::ListBuilder::getPointerElement
              ((PointerBuilder *)&elementType.elementType.field_4,&this->builder,uVar3);
    pOVar4 = kj::mv<capnp::_::OrphanBuilder>(&local_20->builder);
    _::PointerBuilder::adopt((PointerBuilder *)&elementType.elementType.field_4,pOVar4);
    break;
  case LIST:
    _f_2 = (Type)ListSchema::getListElementType(&this->schema);
    TVar2 = Orphan<capnp::DynamicValue>::getType(local_20);
    local_1c1 = false;
    if (TVar2 == LIST) {
      local_1c1 = ListSchema::operator==(&(local_20->field_1).listSchema,(ListSchema *)&f_2);
    }
    if (local_1c1 == false) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[21]>
                (&local_d0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
                 ,0x535,FAILED,
                 "orphan.getType() == DynamicValue::LIST && orphan.listSchema == elementType",
                 "\"Value type mismatch.\"",(char (*) [21])"Value type mismatch.");
      kj::_::Debug::Fault::fatal(&local_d0);
    }
    uVar3 = bounded<unsigned_int>(orphan_local._4_4_);
    _::ListBuilder::getPointerElement((PointerBuilder *)&elementType_1,&this->builder,uVar3);
    pOVar4 = kj::mv<capnp::_::OrphanBuilder>(&local_20->builder);
    _::PointerBuilder::adopt((PointerBuilder *)&elementType_1,pOVar4);
    break;
  case STRUCT:
    f_3.exception = (Exception *)ListSchema::getStructElementType(&this->schema);
    TVar2 = Orphan<capnp::DynamicValue>::getType(local_20);
    local_1d1 = false;
    if (TVar2 == STRUCT) {
      local_1d1 = Schema::operator==((Schema *)&(local_20->field_1).enumValue,(Schema *)&f_3);
    }
    if (local_1d1 == false) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[21]>
                (&local_f8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
                 ,0x53d,FAILED,
                 "orphan.getType() == DynamicValue::STRUCT && orphan.structSchema == elementType",
                 "\"Value type mismatch.\"",(char (*) [21])"Value type mismatch.");
      kj::_::Debug::Fault::fatal(&local_f8);
    }
    uVar3 = bounded<unsigned_int>(orphan_local._4_4_);
    _::ListBuilder::getStructElement(&local_120,&this->builder,uVar3);
    pOVar4 = &local_20->builder;
    size = anon_unknown_70::structSizeFromSchema((StructSchema)f_3.exception);
    _::OrphanBuilder::asStruct(&local_148,pOVar4,size);
    other.capTable = local_148.capTable;
    other.segment = local_148.segment;
    other.data = local_148.data;
    other.pointers = local_148.pointers;
    other.dataSize = local_148.dataSize;
    other.pointerCount = local_148.pointerCount;
    other._38_2_ = local_148._38_2_;
    _::StructBuilder::transferContentFrom(&local_120,other);
    break;
  case INTERFACE:
    other_00 = ListSchema::getInterfaceElementType(&this->schema);
    TVar2 = Orphan<capnp::DynamicValue>::getType(local_20);
    local_1e9 = false;
    if (TVar2 == CAPABILITY) {
      f_5.exception = (Exception *)other_00;
      local_1e9 = InterfaceSchema::extends(&(local_20->field_1).interfaceSchema,other_00);
    }
    if (local_1e9 == false) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[21]>
                (&local_178,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
                 ,0x54a,FAILED,
                 "orphan.getType() == DynamicValue::CAPABILITY && orphan.interfaceSchema.extends(elementType)"
                 ,"\"Value type mismatch.\"",(char (*) [21])"Value type mismatch.");
      kj::_::Debug::Fault::fatal(&local_178);
    }
    uVar3 = bounded<unsigned_int>(orphan_local._4_4_);
    _::ListBuilder::getPointerElement(&local_190,&this->builder,uVar3);
    pOVar4 = kj::mv<capnp::_::OrphanBuilder>(&local_20->builder);
    _::PointerBuilder::adopt(&local_190,pOVar4);
    break;
  case ANY_POINTER:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[32]>
              ((Fault *)&elementType_2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x544,FAILED,(char *)0x0,"\"List(AnyPointer) not supported.\"",
               (char (*) [32])"List(AnyPointer) not supported.");
    kj::_::Debug::Fault::fatal((Fault *)&elementType_2);
  default:
    kj::_::unreachable();
  }
  return;
}

Assistant:

void DynamicList::Builder::adopt(uint index, Orphan<DynamicValue>&& orphan) {
  switch (schema.whichElementType()) {
    case schema::Type::VOID:
    case schema::Type::BOOL:
    case schema::Type::INT8:
    case schema::Type::INT16:
    case schema::Type::INT32:
    case schema::Type::INT64:
    case schema::Type::UINT8:
    case schema::Type::UINT16:
    case schema::Type::UINT32:
    case schema::Type::UINT64:
    case schema::Type::FLOAT32:
    case schema::Type::FLOAT64:
    case schema::Type::ENUM:
      set(index, orphan.getReader());
      return;

    case schema::Type::TEXT:
      KJ_REQUIRE(orphan.getType() == DynamicValue::TEXT, "Value type mismatch.");
      builder.getPointerElement(bounded(index) * ELEMENTS).adopt(kj::mv(orphan.builder));
      return;

    case schema::Type::DATA:
      KJ_REQUIRE(orphan.getType() == DynamicValue::DATA, "Value type mismatch.");
      builder.getPointerElement(bounded(index) * ELEMENTS).adopt(kj::mv(orphan.builder));
      return;

    case schema::Type::LIST: {
      ListSchema elementType = schema.getListElementType();
      KJ_REQUIRE(orphan.getType() == DynamicValue::LIST && orphan.listSchema == elementType,
                 "Value type mismatch.");
      builder.getPointerElement(bounded(index) * ELEMENTS).adopt(kj::mv(orphan.builder));
      return;
    }

    case schema::Type::STRUCT: {
      auto elementType = schema.getStructElementType();
      KJ_REQUIRE(orphan.getType() == DynamicValue::STRUCT && orphan.structSchema == elementType,
                 "Value type mismatch.");
      builder.getStructElement(bounded(index) * ELEMENTS).transferContentFrom(
          orphan.builder.asStruct(structSizeFromSchema(elementType)));
      return;
    }

    case schema::Type::ANY_POINTER:
      KJ_FAIL_ASSERT("List(AnyPointer) not supported.");

    case schema::Type::INTERFACE: {
      auto elementType = schema.getInterfaceElementType();
      KJ_REQUIRE(orphan.getType() == DynamicValue::CAPABILITY &&
                 orphan.interfaceSchema.extends(elementType),
                 "Value type mismatch.");
      builder.getPointerElement(bounded(index) * ELEMENTS).adopt(kj::mv(orphan.builder));
      return;
    }
  }

  KJ_UNREACHABLE;
}